

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

void __thiscall
mp::internal::NLFileReader<MockFile>::Read
          (NLFileReader<MockFile> *this,MemoryBuffer<char,_1UL,_std::allocator<char>_> *array)

{
  char *pcVar1;
  ssize_t sVar2;
  Buffer<char> *in_RSI;
  MockFile *in_RDI;
  size_t offset;
  size_t in_stack_ffffffffffffffd8;
  MockFile *this_00;
  _func_int **local_18;
  
  fmt::Buffer<char>::resize((Buffer<char> *)in_RDI,in_stack_ffffffffffffffd8);
  for (local_18 = (_func_int **)0x0;
      local_18 <
      in_RDI[1].gmockconst0_descriptor_35.super_FunctionMockerBase<int_()>.
      super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase;
      local_18 = (_func_int **)(sVar2 + (long)local_18)) {
    this_00 = in_RDI;
    pcVar1 = fmt::Buffer<char>::operator[](in_RSI,(size_t)local_18);
    sVar2 = MockFile::read(this_00,(int)pcVar1,
                           (void *)((long)this_00[1].gmockconst0_descriptor_35.
                                          super_FunctionMockerBase<int_()>.
                                          super_UntypedFunctionMockerBase.
                                          _vptr_UntypedFunctionMockerBase - (long)local_18),
                           (size_t)in_RDI);
    in_RDI = this_00;
  }
  pcVar1 = fmt::Buffer<char>::operator[]
                     (in_RSI,(size_t)in_RDI[1].gmockconst0_descriptor_35.
                                     super_FunctionMockerBase<int_()>.
                                     super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase
                     );
  *pcVar1 = '\0';
  return;
}

Assistant:

void mp::internal::NLFileReader<File>::Read(
    fmt::internal::MemoryBuffer<char, 1> &array) {
  array.resize(size_ + 1);
  std::size_t offset = 0;
  while (offset < size_)
    offset += file_.read(&array[offset], size_ - offset);
  array[size_] = 0;
}